

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O2

BuildValue * __thiscall
llbuild::buildsystem::ExternalCommand::getResultForOutput
          (BuildValue *__return_storage_ptr__,ExternalCommand *this,Node *node,BuildValue *value)

{
  bool bVar1;
  uint uVar2;
  __normal_iterator<llbuild::buildsystem::BuildNode_**,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
  _Var3;
  FileInfo *this_00;
  uint64_t *puVar4;
  long lVar5;
  byte bVar6;
  FileInfo in_stack_ffffffffffffff88;
  Node *node_local;
  
  bVar6 = 0;
  node_local = node;
  switch(value->kind) {
  case SuccessfulCommand:
  case SuccessfulCommandWithOutputSignature:
    if ((*(char *)&node[1]._vptr_Node == '\x03') &&
       (*(char *)((long)&node[1]._vptr_Node + 1) == '\0')) {
      __return_storage_ptr__->kind = VirtualInput;
    }
    else {
      _Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<llbuild::buildsystem::BuildNode**,std::vector<llbuild::buildsystem::BuildNode*,std::allocator<llbuild::buildsystem::BuildNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<llbuild::buildsystem::Node*const>>
                        ((this->super_Command).outputs.
                         super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->super_Command).outputs.
                         super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&node_local);
      if (_Var3._M_current ==
          (this->super_Command).outputs.
          super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __assert_fail("it != outputs.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ExternalCommand.cpp"
                      ,0x9c,
                      "virtual BuildValue llbuild::buildsystem::ExternalCommand::getResultForOutput(Node *, const BuildValue &)"
                     );
      }
      lVar5 = (long)_Var3._M_current -
              (long)(this->super_Command).outputs.
                    super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
      uVar2 = BuildValue::getNumOutputs(value);
      if ((long)(ulong)uVar2 <= lVar5) {
        __assert_fail("idx < static_cast<ssize_t>(value.getNumOutputs())",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ExternalCommand.cpp"
                      ,0x9f,
                      "virtual BuildValue llbuild::buildsystem::ExternalCommand::getResultForOutput(Node *, const BuildValue &)"
                     );
      }
      this_00 = BuildValue::getNthOutputInfo(value,(uint)lVar5);
      bVar1 = llbuild::basic::FileInfo::isMissing(this_00);
      if (!bVar1) {
        puVar4 = (uint64_t *)&stack0xffffffffffffff88;
        for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
          *puVar4 = this_00->device;
          this_00 = (FileInfo *)((long)this_00 + (ulong)bVar6 * -0x10 + 8);
          puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
        }
        BuildValue::makeExistingInput(in_stack_ffffffffffffff88);
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->kind = MissingOutput;
    }
    break;
  case FailedCommand:
  case PropagatedFailureCommand:
  case CancelledCommand:
    __return_storage_ptr__->kind = FailedInput;
    break;
  case SkippedCommand:
    __return_storage_ptr__->kind = SkippedCommand;
    break;
  default:
    __assert_fail("value.isSuccessfulCommand()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ExternalCommand.cpp"
                  ,0x8c,
                  "virtual BuildValue llbuild::buildsystem::ExternalCommand::getResultForOutput(Node *, const BuildValue &)"
                 );
  }
  *(undefined8 *)&__return_storage_ptr__->numOutputInfos = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->signature).value + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.device + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.inode + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.mode + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.size + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.modTime.seconds + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.modTime.nanoseconds + 4) =
       0;
  *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x34) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x3c) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x44) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x4c) = 0;
  (__return_storage_ptr__->stringValues).contents = (char *)0x0;
  (__return_storage_ptr__->stringValues).size = 0;
  return __return_storage_ptr__;
}

Assistant:

BuildValue ExternalCommand::
getResultForOutput(Node* node, const BuildValue& value) {
  // If the value was a failed or cancelled command, propagate the failure.
  if (value.isFailedCommand() || value.isPropagatedFailureCommand() ||
      value.isCancelledCommand())
    return BuildValue::makeFailedInput();
  if (value.isSkippedCommand())
      return BuildValue::makeSkippedCommand();

  // Otherwise, we should have a successful command -- return the actual
  // result for the output.
  assert(value.isSuccessfulCommand());

  // If the node is virtual, the output is always a virtual input value.
  //
  // FIXME: Eliminate this, and make the build value array contain an array of
  // build values.
  auto buildNode = static_cast<BuildNode*>(node);
  if (buildNode->isVirtual() && !buildNode->isCommandTimestamp()) {
    return BuildValue::makeVirtualInput();
  }
    
  // Find the index of the output node.
  //
  // FIXME: This is O(N). We don't expect N to be large in practice, but it
  // could be.
  auto it = std::find(outputs.begin(), outputs.end(), node);
  assert(it != outputs.end());
    
  auto idx = it - outputs.begin();
  assert(idx < static_cast<ssize_t>(value.getNumOutputs()));

  auto& info = value.getNthOutputInfo(idx);
  if (info.isMissing())
    return BuildValue::makeMissingOutput();
    
  return BuildValue::makeExistingInput(info);
}